

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

void free_rule(Rule *r)

{
  Elem **__ptr;
  Code **__ptr_00;
  ulong uVar1;
  
  free(r->end);
  free((r->final_code).code);
  free((r->speculative_code).code);
  __ptr = (r->elems).v;
  if (__ptr != (r->elems).e && __ptr != (Elem **)0x0) {
    free(__ptr);
  }
  (r->elems).n = 0;
  (r->elems).v = (Elem **)0x0;
  for (uVar1 = 0; __ptr_00 = (r->pass_code).v, uVar1 < (r->pass_code).n; uVar1 = uVar1 + 1) {
    free(__ptr_00[uVar1]->code);
    free((r->pass_code).v[uVar1]);
  }
  if (__ptr_00 != (r->pass_code).e && __ptr_00 != (Code **)0x0) {
    free(__ptr_00);
  }
  free(r);
  return;
}

Assistant:

static void free_rule(Rule *r) {
  uint i;
  FREE(r->end);
  if (r->final_code.code) FREE(r->final_code.code);
  if (r->speculative_code.code) FREE(r->speculative_code.code);
  vec_free(&r->elems);
  for (i = 0; i < r->pass_code.n; i++) {
    FREE(r->pass_code.v[i]->code);
    FREE(r->pass_code.v[i]);
  }
  vec_free(&r->pass_code);
  FREE(r);
}